

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

filtration_algorithm_t * get_custom_filtration_computer(string *algorithm)

{
  bool bVar1;
  filtration_algorithm_t *pfVar2;
  undefined **ppuVar3;
  
  bVar1 = std::operator==(algorithm,"dimension");
  if (bVar1) {
    ppuVar3 = &PTR__filtration_algorithm_t_001662d8;
  }
  else {
    bVar1 = std::operator==(algorithm,"zero");
    if (bVar1) {
      ppuVar3 = &PTR__filtration_algorithm_t_00166340;
    }
    else {
      bVar1 = std::operator==(algorithm,"max");
      if (bVar1) {
        ppuVar3 = &PTR__filtration_algorithm_t_00166398;
      }
      else {
        bVar1 = std::operator==(algorithm,"max3");
        if (bVar1) {
          ppuVar3 = &PTR__filtration_algorithm_t_001663f0;
        }
        else {
          bVar1 = std::operator==(algorithm,"max_plus_one");
          if (bVar1) {
            ppuVar3 = &PTR__filtration_algorithm_t_00166448;
          }
          else {
            bVar1 = std::operator==(algorithm,"product");
            if (bVar1) {
              ppuVar3 = &PTR__filtration_algorithm_t_001664a0;
            }
            else {
              bVar1 = std::operator==(algorithm,"sum");
              if (bVar1) {
                ppuVar3 = &PTR__filtration_algorithm_t_001664f8;
              }
              else {
                bVar1 = std::operator==(algorithm,"pmean");
                if (bVar1) {
                  ppuVar3 = &PTR__filtration_algorithm_t_00166550;
                }
                else {
                  bVar1 = std::operator==(algorithm,"pmoment");
                  if (bVar1) {
                    ppuVar3 = &PTR__filtration_algorithm_t_001665a8;
                  }
                  else {
                    bVar1 = std::operator==(algorithm,"remove_edges");
                    if (bVar1) {
                      ppuVar3 = &PTR__filtration_algorithm_t_00166600;
                    }
                    else {
                      bVar1 = std::operator==(algorithm,"vertex_degree");
                      if (!bVar1) {
                        return (filtration_algorithm_t *)0x0;
                      }
                      ppuVar3 = &PTR__filtration_algorithm_t_00166658;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pfVar2 = (filtration_algorithm_t *)operator_new(8);
  pfVar2->_vptr_filtration_algorithm_t = (_func_int **)ppuVar3;
  return pfVar2;
}

Assistant:

filtration_algorithm_t* get_custom_filtration_computer(std::string algorithm) {
	if (algorithm == "dimension") return new dimension_filtration();
	if (algorithm == "zero") return new zero_filtration();
	if (algorithm == "max") return new max_filtration();
	if (algorithm == "max3") return new max3_filtration();
	if (algorithm == "max_plus_one") return new max_plus_one_filtration();
	if (algorithm == "product") return new product_filtration();
	if (algorithm == "sum") return new sum_filtration();
	if (algorithm == "pmean") return new pmean_filtration();
	if (algorithm == "pmoment") return new pmoment_filtration();
	if (algorithm == "remove_edges") return new remove_edges_filtration();
	if (algorithm == "vertex_degree") return new vertex_degree_filtration();

	return nullptr;
}